

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

wostream * mjs::operator<<(wostream *os,completion_type *t)

{
  wostream *this;
  wstring local_1d8 [32];
  wstring_view local_1b8 [2];
  wostringstream local_198 [8];
  wostringstream _woss;
  completion_type *t_local;
  wostream *os_local;
  
  switch(*t) {
  case normal:
    os_local = std::operator<<(os,"normal completion");
    break;
  case break_:
    os_local = std::operator<<(os,"break");
    break;
  case continue_:
    os_local = std::operator<<(os,"continue");
    break;
  case return_:
    os_local = std::operator<<(os,"return");
    break;
  case throw_:
    os_local = std::operator<<(os,"throw");
    break;
  default:
    std::__cxx11::wostringstream::wostringstream(local_198);
    this = std::operator<<((wostream *)local_198,"Not implemented: ");
    std::wostream::operator<<(this,*t);
    std::__cxx11::wostringstream::str();
    local_1b8[0] = (wstring_view)
                   std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1d8);
    throw_runtime_error(local_1b8,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/interpreter.cpp"
                        ,0x1d);
  }
  return os_local;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const completion_type& t) {
    switch (t) {
    case completion_type::normal: return os << "normal completion";
    case completion_type::break_: return os << "break";
    case completion_type::continue_: return os << "continue";
    case completion_type::return_: return os << "return";
    case completion_type::throw_: return os << "throw";
    }
    NOT_IMPLEMENTED((int)t);
}